

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

void __thiscall CmdLineArgsParser::ParseFlag(CmdLineArgsParser *this)

{
  code *pcVar1;
  bool bVar2;
  Flag flag_00;
  char16 cVar3;
  Flag flag_01;
  FlagTypes FVar4;
  int iVar5;
  LPWSTR pWVar6;
  ulong uVar7;
  Exception *pEVar8;
  undefined4 *puVar9;
  Phases *pPhaseList;
  String *this_00;
  Number *pNVar10;
  NumberSet *numberPairSet;
  NumberPairSet *numberPairSet_00;
  NumberTrioSet *numberTrioSet;
  NumberRange *pRange;
  Phases *local_448;
  Phases *oppositePhase;
  Flag oppositeFlag;
  Boolean boolValue;
  FlagTypes flagType;
  Flag flag;
  LPWSTR flagString;
  char16 buffer [512];
  CmdLineArgsParser *this_local;
  
  memset(&flagString,0,0x400);
  pWVar6 = ParseString(this,(LPWSTR)&flagString,0x200,true);
  flag_00 = Js::ConfigFlagsTable::GetFlag(pWVar6);
  if (flag_00 == InvalidFlag) {
    if ((this->pCustomConfigFlags == (ICustomConfigFlags *)0x0) ||
       (uVar7 = (**(code **)(*(long *)this->pCustomConfigFlags + 8))
                          (this->pCustomConfigFlags,pWVar6), (uVar7 & 1) == 0)) {
      pEVar8 = (Exception *)__cxa_allocate_exception(8);
      Exception::Exception(pEVar8,L"Invalid Flag");
      __cxa_throw(pEVar8,&Exception::typeinfo,0);
    }
  }
  else {
    FVar4 = Js::ConfigFlagsTable::GetFlagType(flag_00);
    if (FVar4 == InvalidFlagType) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/CmdParser.cpp"
                         ,0x220,"(InvalidFlagType != flagType)","Invalid flag type");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    Js::ConfigFlagsTable::Enable(this->flagTable,flag_00);
    if (FVar4 == FlagBoolean) {
      bVar2 = ParseBoolean(this);
      Js::ConfigFlagsTable::SetAsBoolean(this->flagTable,flag_00,bVar2);
    }
    else {
      cVar3 = CurChar(this);
      if ((cVar3 != L'\0') && (cVar3 != L' ')) {
        if (cVar3 != L':') {
          pEVar8 = (Exception *)__cxa_allocate_exception(8);
          Exception::Exception(pEVar8,L"Expected \':\'");
          __cxa_throw(pEVar8,&Exception::typeinfo,0);
        }
        NextChar(this);
        switch(FVar4) {
        case FlagString:
          pWVar6 = ParseString(this,(LPWSTR)&flagString,0x200,false);
          this_00 = Js::ConfigFlagsTable::GetAsString(this->flagTable,flag_00);
          Js::String::operator=(this_00,pWVar6);
          break;
        case FlagPhases:
          flag_01 = Js::ConfigFlagsTable::GetOppositePhaseFlag(this->flagTable,flag_00);
          local_448 = (Phases *)0x0;
          if (flag_01 != InvalidFlag) {
            Js::ConfigFlagsTable::Enable(this->flagTable,flag_01);
            local_448 = Js::ConfigFlagsTable::GetAsPhase(this->flagTable,flag_01);
          }
          pPhaseList = Js::ConfigFlagsTable::GetAsPhase(this->flagTable,flag_00);
          ParsePhase(this,pPhaseList,local_448);
          break;
        case FlagNumber:
          iVar5 = ParseInteger(this);
          pNVar10 = Js::ConfigFlagsTable::GetAsNumber(this->flagTable,flag_00);
          *pNVar10 = iVar5;
          break;
        default:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/CmdParser.cpp"
                             ,600,"(0)","Flag not Handled");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
          break;
        case FlagNumberSet:
          numberPairSet = Js::ConfigFlagsTable::GetAsNumberSet(this->flagTable,flag_00);
          ParseNumberSet(this,numberPairSet);
          break;
        case FlagNumberPairSet:
          numberPairSet_00 = Js::ConfigFlagsTable::GetAsNumberPairSet(this->flagTable,flag_00);
          ParseNumberPairSet(this,numberPairSet_00);
          break;
        case FlagNumberTrioSet:
          numberTrioSet = Js::ConfigFlagsTable::GetAsNumberTrioSet(this->flagTable,flag_00);
          ParseNumberTrioSet(this,numberTrioSet);
          break;
        case FlagNumberRange:
          pRange = Js::ConfigFlagsTable::GetAsNumberRange(this->flagTable,flag_00);
          ParseNumberRange(this,pRange);
        }
      }
    }
  }
  return;
}

Assistant:

void
CmdLineArgsParser::ParseFlag()
{
    char16 buffer[MaxTokenSize];
    ZeroMemory(buffer, sizeof(buffer));

    LPWSTR flagString = ParseString(buffer);
    Flag flag = ConfigFlagsTable::GetFlag(flagString);
    if(InvalidFlag == flag)
    {
        if (pCustomConfigFlags != nullptr)
        {
            if (pCustomConfigFlags->ParseFlag(flagString, this))
            {
                return;
            }
        }
        throw Exception(_u("Invalid Flag"));
    }


    FlagTypes flagType = ConfigFlagsTable::GetFlagType(flag);
    AssertMsg(InvalidFlagType != flagType, "Invalid flag type");

    this->flagTable.Enable(flag);

    if(FlagBoolean == flagType)
    {
        Boolean boolValue = ParseBoolean();

        this->flagTable.SetAsBoolean(flag, boolValue);
    }
    else
    {
        switch(CurChar())
        {
        case ':':
            NextChar();
            switch(flagType)
            {
            case FlagPhases:
            {
                Flag oppositeFlag = this->flagTable.GetOppositePhaseFlag(flag);
                Phases* oppositePhase = nullptr;
                if (oppositeFlag != InvalidFlag)
                {
                    this->flagTable.Enable(oppositeFlag);
                    oppositePhase = this->flagTable.GetAsPhase(oppositeFlag);
                }
                ParsePhase(this->flagTable.GetAsPhase(flag), oppositePhase);
                break;
            }

            case FlagString:
                *this->flagTable.GetAsString(flag) = ParseString(buffer, MaxTokenSize, false);
                break;

            case FlagNumber:
                *this->flagTable.GetAsNumber(flag) = ParseInteger();
                break;

            case FlagNumberSet:
                ParseNumberSet(this->flagTable.GetAsNumberSet(flag));
                break;

            case FlagNumberPairSet:
                ParseNumberPairSet(this->flagTable.GetAsNumberPairSet(flag));
                break;

            case FlagNumberTrioSet:
                ParseNumberTrioSet(this->flagTable.GetAsNumberTrioSet(flag));
                break;

            case FlagNumberRange:
                ParseNumberRange(this->flagTable.GetAsNumberRange(flag));
                break;

            default:
                AssertMsg(0, "Flag not Handled");
            }
            break;
        case ' ':
        case 0:
            break;
        default:
            throw Exception(_u("Expected ':'"));
        }
    }
}